

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d715c4::Scenario::RequestedTx
          (Scenario *this,NodeId peer,uint256 *txhash,microseconds exptime)

{
  long lVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *in_RCX;
  anon_class_56_4_0c4f9ee1 *in_RSI;
  duration<long,_std::ratio<1L,_1000000L>_> *in_RDI;
  long in_FS_OFFSET;
  Runner *runner;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
  ::
  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::RequestedTx(long,uint256_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
            (in_RCX,in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RequestedTx(NodeId peer, const uint256& txhash, std::chrono::microseconds exptime)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.RequestedTx(peer, txhash, exptime);
            runner.txrequest.SanityCheck();
        });
    }